

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O0

size_t ZSTD_compressBlock_lazy2
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,
                 ZSTD_compressionParameters *cParams,void *src,size_t srcSize)

{
  uint uVar1;
  int iVar2;
  U32 UVar3;
  U32 UVar4;
  size_t sVar5;
  long lVar6;
  ulong uVar7;
  undefined8 in_RCX;
  uint *in_RDX;
  long in_RDI;
  void *in_R8;
  long in_R9;
  bool bVar8;
  size_t litLength;
  int gain1_3;
  int gain2_3;
  size_t ml2_3;
  size_t offset2_1;
  int gain1_2;
  int gain2_2;
  size_t ml2_2;
  int gain1_1;
  int gain2_1;
  size_t ml2_1;
  size_t offset2;
  int gain1;
  int gain2;
  size_t mlRep;
  size_t ml2;
  size_t offsetFound;
  BYTE *start;
  size_t offset;
  size_t matchLength;
  U32 maxRep;
  U32 savedOffset;
  U32 offset_2;
  U32 offset_1;
  searchMax_f searchMax;
  BYTE *base;
  BYTE *ilimit;
  BYTE *iend;
  BYTE *anchor;
  BYTE *ip;
  BYTE *istart;
  uint local_188;
  U32 in_stack_fffffffffffffe7c;
  uint uVar9;
  U32 in_stack_fffffffffffffe80;
  undefined2 in_stack_fffffffffffffe84;
  undefined1 in_stack_fffffffffffffe86;
  undefined1 uVar10;
  undefined1 in_stack_fffffffffffffe87;
  size_t in_stack_fffffffffffffe88;
  seqStore_t *in_stack_fffffffffffffe90;
  BYTE *in_stack_fffffffffffffea8;
  BYTE *in_stack_fffffffffffffeb0;
  BYTE *in_stack_fffffffffffffeb8;
  ulong local_e8;
  int local_e0;
  int local_dc;
  ulong local_d8;
  int local_d0;
  int local_cc;
  ulong local_c8;
  ulong local_c0;
  int local_b8;
  int local_b4;
  ulong local_b0;
  ulong local_a8;
  ulong local_a0;
  void *local_98;
  ulong local_90;
  ulong local_88;
  uint local_80;
  uint local_7c;
  uint local_78;
  uint local_74;
  code *local_70;
  void *local_68;
  void *local_60;
  long local_58;
  void *local_50;
  void *local_48;
  int local_38;
  undefined4 local_34;
  undefined8 local_20;
  uint *local_18;
  long local_8;
  
  local_34 = 0;
  local_38 = 2;
  local_58 = (long)in_R8 + in_R9;
  local_60 = (void *)(local_58 + -8);
  local_68 = (void *)(*(long *)(in_RDI + 8) + (ulong)*(uint *)(in_RDI + 0x18));
  local_70 = ZSTD_HcFindBestMatch_selectMLS;
  uVar9 = *in_RDX;
  uVar1 = in_RDX[1];
  local_7c = 0;
  local_48 = (void *)((long)in_R8 + (long)(int)(uint)(in_R8 == local_68));
  *(undefined4 *)(in_RDI + 0x28) = *(undefined4 *)(in_RDI + 0x24);
  local_80 = (int)local_48 - (int)local_68;
  local_78 = uVar1;
  if (local_80 < uVar1) {
    local_78 = 0;
    local_7c = uVar1;
  }
  local_74 = uVar9;
  local_50 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_8 = in_RDI;
  if (local_80 < uVar9) {
    local_74 = 0;
    local_7c = uVar9;
  }
  do {
    while( true ) {
      if (local_60 <= local_48) {
        uVar9 = local_7c;
        if (local_74 != 0) {
          uVar9 = local_74;
        }
        *local_18 = uVar9;
        if (local_78 == 0) {
          local_188 = local_7c;
        }
        else {
          local_188 = local_78;
        }
        local_18[1] = local_188;
        return local_58 - (long)local_50;
      }
      local_88 = 0;
      local_90 = 0;
      local_98 = (void *)((long)local_48 + 1);
      bVar8 = local_74 == 0;
      UVar3 = MEM_read32((void *)((long)local_48 + 1));
      UVar4 = MEM_read32((void *)((long)local_48 + (1 - (ulong)local_74)));
      if (bVar8 || UVar3 != UVar4) break;
      sVar5 = ZSTD_count(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                         in_stack_fffffffffffffea8);
      local_88 = sVar5 + 4;
      if (local_38 != 0) break;
LAB_002aa7a9:
      ZSTD_storeSeq(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                    (void *)CONCAT17(in_stack_fffffffffffffe87,
                                     CONCAT16(in_stack_fffffffffffffe86,
                                              CONCAT24(in_stack_fffffffffffffe84,
                                                       in_stack_fffffffffffffe80))),
                    in_stack_fffffffffffffe7c,0x2aa7f7);
      local_48 = (void *)((long)local_98 + local_88);
      while( true ) {
        uVar10 = false;
        local_50 = local_48;
        if (local_48 <= local_60 && local_78 != 0) {
          in_stack_fffffffffffffe80 = MEM_read32(local_48);
          UVar3 = MEM_read32((void *)((long)local_48 - (ulong)local_78));
          uVar10 = in_stack_fffffffffffffe80 == UVar3;
        }
        if ((bool)uVar10 == false) break;
        sVar5 = ZSTD_count(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                           in_stack_fffffffffffffea8);
        uVar9 = local_78;
        local_88 = sVar5 + 4;
        local_90 = (ulong)local_78;
        local_78 = local_74;
        local_74 = uVar9;
        ZSTD_storeSeq(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                      (void *)CONCAT17(in_stack_fffffffffffffe87,
                                       CONCAT16(uVar10,CONCAT24(in_stack_fffffffffffffe84,
                                                                in_stack_fffffffffffffe80))),
                      in_stack_fffffffffffffe7c,0x2aa92c);
        local_48 = (void *)(local_88 + (long)local_48);
      }
      in_stack_fffffffffffffe86 = 0;
    }
    local_a0 = 99999999;
    local_a8 = (*local_70)(local_8,local_20,local_48,local_58,&local_a0);
    if (local_88 < local_a8) {
      local_98 = local_48;
      local_90 = local_a0;
      local_88 = local_a8;
    }
    if (3 < local_88) {
      if (local_38 != 0) {
        while (local_48 < local_60) {
          local_48 = (void *)((long)local_48 + 1);
          if (local_90 != 0) {
            bVar8 = local_74 != 0;
            UVar3 = MEM_read32(local_48);
            UVar4 = MEM_read32((void *)((long)local_48 - (ulong)local_74));
            if (bVar8 && UVar3 == UVar4) {
              sVar5 = ZSTD_count(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                                 in_stack_fffffffffffffea8);
              local_b0 = sVar5 + 4;
              local_b4 = (int)local_b0 * 3;
              in_stack_fffffffffffffeb8 = (BYTE *)(local_88 * 3);
              UVar3 = ZSTD_highbit32((int)local_90 + 1);
              local_b8 = ((int)in_stack_fffffffffffffeb8 - UVar3) + 1;
              if ((3 < local_b0) && (local_b8 < local_b4)) {
                local_88 = local_b0;
                local_90 = 0;
                local_98 = local_48;
              }
            }
          }
          local_c0 = 99999999;
          local_c8 = (*local_70)(local_8,local_20,local_48,local_58,&local_c0);
          in_stack_fffffffffffffea8 = (BYTE *)(local_c8 << 2);
          UVar3 = ZSTD_highbit32((int)local_c0 + 1);
          local_cc = (int)in_stack_fffffffffffffea8 - UVar3;
          in_stack_fffffffffffffeb0 = (BYTE *)(local_88 << 2);
          UVar3 = ZSTD_highbit32((int)local_90 + 1);
          local_d0 = ((int)in_stack_fffffffffffffeb0 - UVar3) + 4;
          if ((local_c8 < 4) || (local_cc <= local_d0)) {
            if ((local_38 != 2) || (local_60 <= local_48)) break;
            local_48 = (void *)((long)local_48 + 1);
            if (local_90 != 0) {
              bVar8 = local_74 != 0;
              UVar3 = MEM_read32(local_48);
              UVar4 = MEM_read32((void *)((long)local_48 - (ulong)local_74));
              if (bVar8 && UVar3 == UVar4) {
                sVar5 = ZSTD_count(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                                   in_stack_fffffffffffffea8);
                local_d8 = sVar5 + 4;
                local_dc = (int)local_d8 * 4;
                lVar6 = local_88 << 2;
                UVar3 = ZSTD_highbit32((int)local_90 + 1);
                local_e0 = ((int)lVar6 - UVar3) + 1;
                if ((3 < local_d8) && (local_e0 < local_dc)) {
                  local_88 = local_d8;
                  local_90 = 0;
                  local_98 = local_48;
                }
              }
            }
            local_e8 = 99999999;
            uVar7 = (*local_70)(local_8,local_20,local_48,local_58,&local_e8);
            in_stack_fffffffffffffe88 = uVar7 << 2;
            UVar3 = ZSTD_highbit32((int)local_e8 + 1);
            iVar2 = (int)in_stack_fffffffffffffe88;
            in_stack_fffffffffffffe90 = (seqStore_t *)(local_88 << 2);
            UVar4 = ZSTD_highbit32((int)local_90 + 1);
            if ((uVar7 < 4) ||
               ((int)(iVar2 - UVar3) <= (int)(((int)in_stack_fffffffffffffe90 - UVar4) + 7))) break;
            local_90 = local_e8;
            local_98 = local_48;
            local_88 = uVar7;
          }
          else {
            local_90 = local_c0;
            local_98 = local_48;
            local_88 = local_c8;
          }
        }
      }
      if (local_90 != 0) {
        while( true ) {
          bVar8 = false;
          if (local_50 < local_98 && local_68 < (void *)((long)local_98 - (local_90 - 2))) {
            bVar8 = *(char *)((long)local_98 + -1) ==
                    *(char *)((long)local_98 + (-1 - (local_90 - 2)));
          }
          if (!bVar8) break;
          local_98 = (void *)((long)local_98 + -1);
          local_88 = local_88 + 1;
        }
        local_78 = local_74;
        local_74 = (int)local_90 - 2;
        in_stack_fffffffffffffe87 = 0;
      }
      goto LAB_002aa7a9;
    }
    local_48 = (void *)(((long)local_48 - (long)local_50 >> 8) + 1 + (long)local_48);
  } while( true );
}

Assistant:

size_t ZSTD_compressBlock_lazy2(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        ZSTD_compressionParameters const* cParams, void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, cParams, src, srcSize, 0, 2);
}